

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bocsu.cpp
# Opt level: O2

UChar32 u_writeIdenticalLevelRun_63(UChar32 prev,UChar *s,int32_t length,ByteSink *sink)

{
  ulong uVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  char *pcVar5;
  char cVar6;
  int iVar7;
  char *pcVar8;
  byte bVar9;
  long lVar10;
  uint uVar11;
  bool bVar12;
  int32_t capacity;
  uint local_84;
  ByteSink *local_80;
  char scratch [64];
  
  local_84 = length * 2;
  iVar7 = 0;
  local_80 = sink;
LAB_0022b293:
  if (length <= iVar7) {
    return prev;
  }
  iVar3 = (*local_80->_vptr_ByteSink[3])(local_80,1,(ulong)local_84,scratch,0x40,&capacity);
  pcVar8 = (char *)CONCAT44(extraout_var,iVar3);
  if (capacity < 0x10) {
    capacity = 0x40;
    pcVar8 = scratch;
  }
  pcVar5 = pcVar8;
LAB_0022b2f0:
  while( true ) {
    if ((length <= iVar7) || (pcVar8 + ((ulong)(uint)capacity - 4) < pcVar5)) goto LAB_0022b522;
    uVar11 = prev & 0xffffff80U | 0x50;
    if (0xffffadff < prev - 0xa000U) {
      uVar11 = 0x7654;
    }
    iVar3 = iVar7 + 1;
    prev = (UChar32)(ushort)s[iVar7];
    if ((iVar3 != length && (prev & 0xfc00U) == 0xd800) &&
       (lVar10 = (long)iVar3, ((ushort)s[lVar10] & 0xfc00) == 0xdc00)) break;
    if (prev != 0xfffe) goto LAB_0022b390;
    *pcVar5 = '\x02';
    pcVar5 = pcVar5 + 1;
    prev = 0;
    iVar7 = iVar3;
  }
  iVar3 = iVar7 + 2;
  prev = prev * 0x400 + (uint)(ushort)s[lVar10] + 0xfca02400;
LAB_0022b390:
  uVar11 = prev - uVar11;
  iVar7 = iVar3;
  if ((int)uVar11 < -0x50) {
    if (0xffffd653 < uVar11) {
      uVar4 = (-uVar11 & 0xffff) % 0xfd;
      cVar6 = -(char)uVar4;
      bVar9 = (byte)((-uVar11 & 0xffff) / 0xfd);
      bVar2 = ~bVar9;
      if ((short)uVar4 == 0) {
        cVar6 = '\x03';
        bVar2 = -bVar9;
      }
      *pcVar5 = bVar2 + 0x31;
      pcVar5[1] = cVar6;
      pcVar5 = pcVar5 + 2;
      goto LAB_0022b2f0;
    }
    uVar1 = (ulong)-uVar11 % 0xfd;
    cVar6 = -(char)uVar1;
    bVar12 = (int)uVar1 != 0;
    if (!bVar12) {
      cVar6 = '\x03';
    }
    uVar4 = (uint)bVar12 + -uVar11 / 0xfd;
    if (uVar11 < 0xfffd0eee) {
      pcVar5[3] = cVar6;
      bVar12 = (int)((ulong)uVar4 % 0xfd) != 0;
      cVar6 = -(char)((ulong)uVar4 % 0xfd);
      if (!bVar12) {
        cVar6 = '\x03';
      }
      pcVar5[2] = cVar6;
      uVar11 = (uVar4 / 0xfd + (uint)bVar12 & 0xffff) % 0xfd;
      cVar6 = -(char)uVar11;
      if ((short)uVar11 == 0) {
        cVar6 = '\x03';
      }
      pcVar5[1] = cVar6;
      *pcVar5 = '\x03';
      pcVar5 = pcVar5 + 4;
      goto LAB_0022b2f0;
    }
    pcVar5[2] = cVar6;
    uVar11 = (uVar4 & 0xffff) % 0xfd;
    bVar9 = (byte)((uVar4 & 0xffff) / 0xfd);
    bVar2 = ~bVar9;
    cVar6 = -(char)uVar11;
    if ((short)uVar11 == 0) {
      bVar2 = -bVar9;
      cVar6 = '\x03';
    }
    pcVar5[1] = cVar6;
    cVar6 = bVar2 + 7;
  }
  else {
    if ((int)uVar11 < 0x51) {
      *pcVar5 = (char)uVar11 + -0x7f;
      pcVar5 = pcVar5 + 1;
      goto LAB_0022b2f0;
    }
    if (uVar11 < 0x29ac) {
      *pcVar5 = (char)((uVar11 & 0xffff) / 0xfd) + -0x2e;
      pcVar5[1] = (char)((uVar11 & 0xffff) % 0xfd) + '\x03';
      pcVar5 = pcVar5 + 2;
      goto LAB_0022b2f0;
    }
    uVar1 = (ulong)uVar11 / 0xfd;
    cVar6 = (char)((ulong)uVar11 % 0xfd) + '\x03';
    if (0x2f111 < uVar11) {
      pcVar5[3] = cVar6;
      pcVar5[2] = (char)(uVar1 % 0xfd) + '\x03';
      pcVar5[1] = (char)((ushort)((ulong)uVar11 / 0xfa09) % 0xfd) + '\x03';
      *pcVar5 = -1;
      pcVar5 = pcVar5 + 4;
      goto LAB_0022b2f0;
    }
    pcVar5[2] = cVar6;
    pcVar5[1] = (char)((uint)(ushort)uVar1 % 0xfd) + '\x03';
    cVar6 = (char)((ulong)uVar11 / 0xfa09) + -4;
  }
  *pcVar5 = cVar6;
  pcVar5 = pcVar5 + 3;
  goto LAB_0022b2f0;
LAB_0022b522:
  (*local_80->_vptr_ByteSink[2])(local_80,pcVar8,(ulong)(uint)((int)pcVar5 - (int)pcVar8));
  goto LAB_0022b293;
}

Assistant:

U_CFUNC UChar32
u_writeIdenticalLevelRun(UChar32 prev, const UChar *s, int32_t length, icu::ByteSink &sink) {
    char scratch[64];
    int32_t capacity;

    int32_t i=0;
    while(i<length) {
        char *buffer=sink.GetAppendBuffer(1, length*2, scratch, (int32_t)sizeof(scratch), &capacity);
        uint8_t *p;
        // We must have capacity>=SLOPE_MAX_BYTES in case u_writeDiff() writes that much,
        // but we do not want to force the sink.GetAppendBuffer() to allocate
        // for a large min_capacity because we might actually only write one byte.
        if(capacity<16) {
            buffer=scratch;
            capacity=(int32_t)sizeof(scratch);
        }
        p=reinterpret_cast<uint8_t *>(buffer);
        uint8_t *lastSafe=p+capacity-SLOPE_MAX_BYTES;
        while(i<length && p<=lastSafe) {
            if(prev<0x4e00 || prev>=0xa000) {
                prev=(prev&~0x7f)-SLOPE_REACH_NEG_1;
            } else {
                /*
                 * Unihan U+4e00..U+9fa5:
                 * double-bytes down from the upper end
                 */
                prev=0x9fff-SLOPE_REACH_POS_2;
            }

            UChar32 c;
            U16_NEXT(s, i, length, c);
            if(c==0xfffe) {
                *p++=2;  // merge separator
                prev=0;
            } else {
                p=u_writeDiff(c-prev, p);
                prev=c;
            }
        }
        sink.Append(buffer, (int32_t)(p-reinterpret_cast<uint8_t *>(buffer)));
    }
    return prev;
}